

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool (anonymous_namespace)::StoreResult<char_const*>
               (OutType infoType,cmMakefile *makefile,string *variable,char *value)

{
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  size_t sVar1;
  bool bVar2;
  string_view value_00;
  
  if (infoType == OutSet) {
    bVar2 = value == (char *)0x0;
    value = "1";
    if (bVar2) {
      value = "0";
    }
    sVar1 = 1;
  }
  else {
    if (value == (char *)0x0) {
      cmMakefile::RemoveDefinition(makefile,variable);
      return (bool)extraout_AL_00;
    }
    sVar1 = strlen(value);
  }
  value_00._M_str = value;
  value_00._M_len = sVar1;
  cmMakefile::AddDefinition(makefile,variable,value_00);
  return (bool)extraout_AL;
}

Assistant:

bool StoreResult(OutType infoType, cmMakefile& makefile,
                 const std::string& variable, ValueType value)
{
  if (infoType == OutSet) {
    makefile.AddDefinition(variable, value ? "1" : "0");
  } else // if(infoType == OutValue)
  {
    if (value) {
      makefile.AddDefinition(variable, value);
    } else {
      makefile.RemoveDefinition(variable);
    }
  }
  return true;
}